

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O2

void secp256k1_effective_nonce(secp256k1_gej *out_nonce,secp256k1_ge *nonce_pts,secp256k1_scalar *b)

{
  secp256k1_gej tmp;
  secp256k1_gej sStack_b8;
  
  secp256k1_gej_set_ge(&sStack_b8,nonce_pts + 1);
  secp256k1_ecmult(out_nonce,&sStack_b8,b,(secp256k1_scalar *)0x0);
  secp256k1_gej_add_ge_var(out_nonce,out_nonce,nonce_pts,(secp256k1_fe *)0x0);
  return;
}

Assistant:

static void secp256k1_effective_nonce(secp256k1_gej *out_nonce, const secp256k1_ge *nonce_pts, const secp256k1_scalar *b) {
    secp256k1_gej tmp;

    secp256k1_gej_set_ge(&tmp, &nonce_pts[1]);
    secp256k1_ecmult(out_nonce, &tmp, b, NULL);
    secp256k1_gej_add_ge_var(out_nonce, out_nonce, &nonce_pts[0], NULL);
}